

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
* deqp::gles2::Performance::singleValueShaderAttributes
            (vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
             *__return_storage_ptr__,string *nameSpecialization)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  reference pvVar5;
  reference extraout_RAX;
  reference extraout_RAX_00;
  float *pfVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  Vector<float,_16> result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  float local_118 [16];
  AttribSpec local_d8;
  float local_78 [18];
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&local_138,"a_position",nameSpecialization);
  local_78[0xc] = -1.0;
  local_78[0xd] = -1.0;
  local_78[0xe] = 0.0;
  local_78[0xf] = 1.0;
  local_78[8] = -1.0;
  local_78[9] = 1.0;
  local_78[10] = 0.0;
  local_78[0xb] = 1.0;
  local_78[4] = 1.0;
  local_78[5] = -1.0;
  local_78[6] = 0.0;
  local_78[7] = 1.0;
  local_78[0] = 1.0;
  local_78[1] = 1.0;
  local_78[2] = 0.0;
  local_78[3] = 1.0;
  pfVar6 = local_118;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 0.0;
  local_118[4] = 0.0;
  local_118[5] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 0.0;
  local_118[8] = 0.0;
  local_118[9] = 0.0;
  local_118[10] = 0.0;
  local_118[0xb] = 0.0;
  local_118[0xc] = 0.0;
  local_118[0xd] = 0.0;
  local_118[0xe] = 0.0;
  local_118[0xf] = 0.0;
  lVar8 = 0;
  do {
    iVar7 = (int)lVar8;
    pfVar9 = local_78 + 0xc;
    if (((iVar7 != 0) && (pfVar9 = local_78 + 8, iVar7 != 1)) && (pfVar9 = local_78, iVar7 == 2)) {
      pfVar9 = local_78 + 4;
    }
    fVar2 = pfVar9[1];
    fVar3 = pfVar9[2];
    fVar4 = pfVar9[3];
    *pfVar6 = *pfVar9;
    pfVar6[1] = fVar2;
    pfVar6[2] = fVar3;
    pfVar6[3] = fVar4;
    lVar8 = lVar8 + 1;
    pfVar6 = pfVar6 + 4;
  } while (lVar8 != 4);
  paVar1 = &local_d8.name.field_2;
  local_d8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  local_d8.value.m_data[0xc] = local_118[0xc];
  local_d8.value.m_data[0xd] = local_118[0xd];
  local_d8.value.m_data[0xe] = local_118[0xe];
  local_d8.value.m_data[0xf] = local_118[0xf];
  local_d8.value.m_data[8] = local_118[8];
  local_d8.value.m_data[9] = local_118[9];
  local_d8.value.m_data[10] = local_118[10];
  local_d8.value.m_data[0xb] = local_118[0xb];
  local_d8.value.m_data[4] = local_118[4];
  local_d8.value.m_data[5] = local_118[5];
  local_d8.value.m_data[6] = local_118[6];
  local_d8.value.m_data[7] = local_118[7];
  local_d8.value.m_data[0] = local_118[0];
  local_d8.value.m_data[1] = local_118[1];
  local_d8.value.m_data[2] = local_118[2];
  local_d8.value.m_data[3] = local_118[3];
  std::
  vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
  ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
            (__return_storage_ptr__,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.name._M_dataplus._M_p,local_d8.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_138,"a_value",nameSpecialization);
  local_78[0xc] = 1.0;
  local_78[0xd] = 1.0;
  local_78[0xe] = 1.0;
  local_78[0xf] = 1.0;
  local_78[8] = 1.0;
  local_78[9] = 1.0;
  local_78[10] = 1.0;
  local_78[0xb] = 1.0;
  local_78[4] = 1.0;
  local_78[5] = 1.0;
  local_78[6] = 1.0;
  local_78[7] = 1.0;
  local_78[0] = 1.0;
  local_78[1] = 1.0;
  local_78[2] = 1.0;
  local_78[3] = 1.0;
  pfVar6 = local_118;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 0.0;
  local_118[4] = 0.0;
  local_118[5] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 0.0;
  local_118[8] = 0.0;
  local_118[9] = 0.0;
  local_118[10] = 0.0;
  local_118[0xb] = 0.0;
  local_118[0xc] = 0.0;
  local_118[0xd] = 0.0;
  local_118[0xe] = 0.0;
  local_118[0xf] = 0.0;
  lVar8 = 0;
  do {
    iVar7 = (int)lVar8;
    pfVar9 = local_78 + 0xc;
    if (((iVar7 != 0) && (pfVar9 = local_78 + 8, iVar7 != 1)) && (pfVar9 = local_78, iVar7 == 2)) {
      pfVar9 = local_78 + 4;
    }
    fVar2 = pfVar9[1];
    fVar3 = pfVar9[2];
    fVar4 = pfVar9[3];
    *pfVar6 = *pfVar9;
    pfVar6[1] = fVar2;
    pfVar6[2] = fVar3;
    pfVar6[3] = fVar4;
    lVar8 = lVar8 + 1;
    pfVar6 = pfVar6 + 4;
  } while (lVar8 != 4);
  local_d8.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  local_d8.value.m_data[0xc] = local_118[0xc];
  local_d8.value.m_data[0xd] = local_118[0xd];
  local_d8.value.m_data[0xe] = local_118[0xe];
  local_d8.value.m_data[0xf] = local_118[0xf];
  local_d8.value.m_data[8] = local_118[8];
  local_d8.value.m_data[9] = local_118[9];
  local_d8.value.m_data[10] = local_118[10];
  local_d8.value.m_data[0xb] = local_118[0xb];
  local_d8.value.m_data[4] = local_118[4];
  local_d8.value.m_data[5] = local_118[5];
  local_d8.value.m_data[6] = local_118[6];
  local_d8.value.m_data[7] = local_118[7];
  local_d8.value.m_data[0] = local_118[0];
  local_d8.value.m_data[1] = local_118[1];
  local_d8.value.m_data[2] = local_118[2];
  local_d8.value.m_data[3] = local_118[3];
  pvVar5 = std::
           vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
           ::emplace_back<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>
                     (__return_storage_ptr__,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.name._M_dataplus._M_p,local_d8.name.field_2._M_allocated_capacity + 1);
    pvVar5 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    pvVar5 = extraout_RAX_00;
  }
  return (vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
          *)pvVar5;
}

Assistant:

static vector<ShaderCompilerCase::AttribSpec> singleValueShaderAttributes (const string& nameSpecialization)
{
	vector<ShaderCompilerCase::AttribSpec> result;

	result.push_back(ShaderCompilerCase::AttribSpec("a_position" + nameSpecialization,
													combineVec4ToVec16(Vec4(-1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4(-1.0f,  1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f, -1.0f,  0.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  0.0f,  1.0f))));

	result.push_back(ShaderCompilerCase::AttribSpec("a_value" + nameSpecialization,
													combineVec4ToVec16(Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f),
																	   Vec4( 1.0f,  1.0f,  1.0f,  1.0f))));

	return result;
}